

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_Compound(JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t lenRight;
  undefined4 *puVar5;
  ScriptContext *scriptContext;
  CompoundString *this_00;
  char16_t *pcVar6;
  char16_t *local_40;
  CompoundString *leftCs;
  JavascriptString *pstRight_local;
  JavascriptString *this_local;
  
  bVar2 = VarIs<Js::CompoundString,Js::JavascriptString>(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1be,"(VarIs<CompoundString>(this))","VarIs<CompoundString>(this)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1bf,"(pstRight)","pstRight");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  scriptContext = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  cVar4 = GetLength(this);
  lenRight = GetLength(pstRight);
  StringProfiler::RecordConcatenation(scriptContext,cVar4,lenRight,ConcatType_CompoundString);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
  if (bVar2) {
    bVar2 = IsFinalized(pstRight);
    if (bVar2) {
      local_40 = GetString(pstRight);
    }
    else {
      local_40 = L"";
    }
    bVar3 = IsFinalized(pstRight);
    bVar2 = true;
    if (bVar3) {
      cVar4 = GetLength(pstRight);
      bVar2 = 8 < cVar4;
    }
    pcVar6 = L"";
    if (bVar2) {
      pcVar6 = L"...";
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - appending to CompoundString\n"
                  ,local_40,pcVar6);
    Output::Flush();
  }
  this_00 = VarTo<Js::CompoundString,Js::JavascriptString>(this);
  CompoundString::PrepareForAppend(this_00);
  CompoundString::Append(this_00,pstRight);
  return this;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_Compound(JavascriptString* pstRight)
    {
        Assert(VarIs<CompoundString>(this));
        Assert(pstRight);

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_CompoundString);
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - appending to CompoundString\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        CompoundString *const leftCs = VarTo<CompoundString>(this);
        leftCs->PrepareForAppend();
        leftCs->Append(pstRight);
        return this;
    }